

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Times(archive_read *a,_7z_header_info *h,int type)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  uchar *data;
  uchar *puVar4;
  uint64_t uVar5;
  long lVar6;
  uint local_50;
  uint i;
  int allAreDefined;
  uchar *timeBools;
  _7zip_entry *entries;
  uchar *p;
  _7zip *zip;
  int type_local;
  _7z_header_info *h_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  lVar2 = *(long *)((long)pvVar1 + 0xa0);
  data = (uchar *)calloc(*(size_t *)((long)pvVar1 + 0x98),1);
  if (data == (uchar *)0x0) {
    return -1;
  }
  puVar4 = header_bytes(a,1);
  if (puVar4 != (uchar *)0x0) {
    if (*puVar4 == '\0') {
      iVar3 = read_Bools(a,data,*(size_t *)((long)pvVar1 + 0x98));
      if (iVar3 < 0) goto LAB_0065bb6d;
    }
    else {
      memset(data,1,*(size_t *)((long)pvVar1 + 0x98));
    }
    puVar4 = header_bytes(a,1);
    if ((puVar4 != (uchar *)0x0) &&
       ((*puVar4 == '\0' ||
        ((iVar3 = parse_7zip_uint64(a,&h->dataIndex), -1 < iVar3 && (h->dataIndex < 0x5f5e101))))))
    {
      local_50 = 0;
      do {
        if (*(ulong *)((long)pvVar1 + 0x98) <= (ulong)local_50) {
          free(data);
          return 0;
        }
        if (data[local_50] != '\0') {
          puVar4 = header_bytes(a,8);
          if (puVar4 == (uchar *)0x0) break;
          if (type == 0x12) {
            uVar5 = archive_le64dec(puVar4);
            fileTimeToUtc(uVar5,(time_t *)(lVar2 + (ulong)local_50 * 0x58 + 0x30),
                          (long *)(lVar2 + (ulong)local_50 * 0x58 + 0x48));
            lVar6 = lVar2 + (ulong)local_50 * 0x58;
            *(uint *)(lVar6 + 0x18) = *(uint *)(lVar6 + 0x18) | 4;
          }
          else if (type == 0x13) {
            uVar5 = archive_le64dec(puVar4);
            fileTimeToUtc(uVar5,(time_t *)(lVar2 + (ulong)local_50 * 0x58 + 0x28),
                          (long *)(lVar2 + (ulong)local_50 * 0x58 + 0x40));
            lVar6 = lVar2 + (ulong)local_50 * 0x58;
            *(uint *)(lVar6 + 0x18) = *(uint *)(lVar6 + 0x18) | 2;
          }
          else if (type == 0x14) {
            uVar5 = archive_le64dec(puVar4);
            fileTimeToUtc(uVar5,(time_t *)(lVar2 + (ulong)local_50 * 0x58 + 0x20),
                          (long *)(lVar2 + (ulong)local_50 * 0x58 + 0x38));
            lVar6 = lVar2 + (ulong)local_50 * 0x58;
            *(uint *)(lVar6 + 0x18) = *(uint *)(lVar6 + 0x18) | 1;
          }
        }
        local_50 = local_50 + 1;
      } while( true );
    }
  }
LAB_0065bb6d:
  free(data);
  return -1;
}

Assistant:

static int
read_Times(struct archive_read *a, struct _7z_header_info *h, int type)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7zip_entry *entries = zip->entries;
	unsigned char *timeBools;
	int allAreDefined;
	unsigned i;

	timeBools = calloc((size_t)zip->numFiles, sizeof(*timeBools));
	if (timeBools == NULL)
		return (-1);

	/* Read allAreDefined. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	allAreDefined = *p;
	if (allAreDefined)
		memset(timeBools, 1, (size_t)zip->numFiles);
	else {
		if (read_Bools(a, timeBools, (size_t)zip->numFiles) < 0)
			goto failed;
	}

	/* Read external. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p) {
		if (parse_7zip_uint64(a, &(h->dataIndex)) < 0)
			goto failed;
		if (UMAX_ENTRY < h->dataIndex)
			goto failed;
	}

	for (i = 0; i < zip->numFiles; i++) {
		if (!timeBools[i])
			continue;
		if ((p = header_bytes(a, 8)) == NULL)
			goto failed;
		switch (type) {
		case kCTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].ctime),
			    &(entries[i].ctime_ns));
			entries[i].flg |= CTIME_IS_SET;
			break;
		case kATime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].atime),
			    &(entries[i].atime_ns));
			entries[i].flg |= ATIME_IS_SET;
			break;
		case kMTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].mtime),
			    &(entries[i].mtime_ns));
			entries[i].flg |= MTIME_IS_SET;
			break;
		}
	}

	free(timeBools);
	return (0);
failed:
	free(timeBools);
	return (-1);
}